

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O3

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  pointer pMVar7;
  Mat *this_00;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  float *pfVar13;
  int iVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  int iVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  uint uVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar7->h;
  iVar17 = this->image_width;
  iVar14 = this->image_height;
  if (iVar17 == -0xe9) {
    iVar17 = pMVar7[1].w;
  }
  iVar3 = pMVar7->w;
  if (iVar14 == -0xe9) {
    iVar14 = pMVar7[1].h;
  }
  fVar21 = this->step_width;
  fVar1 = this->step_height;
  uVar4 = (this->min_sizes).w;
  iVar5 = (this->max_sizes).w;
  uVar6 = (this->aspect_ratios).w;
  iVar19 = this->flip;
  if (this->flip != 0) {
    iVar19 = uVar6 * uVar4;
  }
  iVar19 = uVar6 * uVar4 + iVar5 + uVar4 + iVar19;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,iVar3 * uVar2 * iVar19 * 4,2,4,opt->blob_allocator);
  if (0 < (int)uVar2) {
    fVar22 = (float)iVar17;
    fVar24 = (float)iVar14;
    uVar20 = -(uint)(fVar21 == -233.0);
    fVar21 = (float)(~uVar20 & (uint)fVar21 | (uint)(fVar22 / (float)iVar3) & uVar20);
    uVar20 = -(uint)(fVar1 == -233.0);
    uVar28 = (uint)(fVar24 / (float)(int)uVar2) & uVar20;
    pvVar8 = this_00->data;
    auVar29._4_4_ = fVar24;
    auVar29._0_4_ = fVar22;
    auVar29._8_4_ = fVar22;
    auVar29._12_4_ = fVar24;
    auVar29 = rcpps(ZEXT416(uVar28),auVar29);
    fVar23 = auVar29._0_4_;
    fVar25 = auVar29._4_4_;
    fVar26 = auVar29._8_4_;
    fVar27 = auVar29._12_4_;
    fVar23 = (1.0 - fVar22 * fVar23) * fVar23 + fVar23;
    fVar25 = (1.0 - fVar24 * fVar25) * fVar25 + fVar25;
    fVar26 = (1.0 - fVar22 * fVar26) * fVar26 + fVar26;
    fVar27 = (1.0 - fVar24 * fVar27) * fVar27 + fVar27;
    uVar15 = 0;
    do {
      if (0 < iVar3) {
        fVar22 = ((float)(int)uVar15 + this->offset) * (float)(~uVar20 & (uint)fVar1 | uVar28);
        fVar24 = this->offset * fVar21;
        pauVar16 = (undefined1 (*) [16])
                   ((long)pvVar8 + (long)(iVar19 * iVar3 * 4 * (int)uVar15) * 4);
        pvVar9 = (this->min_sizes).data;
        iVar17 = 0;
        do {
          if (0 < (int)uVar4) {
            pvVar10 = (this->max_sizes).data;
            pvVar11 = (this->aspect_ratios).data;
            iVar14 = this->flip;
            uVar18 = 0;
            do {
              fVar31 = *(float *)((long)pvVar9 + uVar18 * 4);
              fVar30 = fVar31 * 0.5;
              auVar33._0_4_ = (fVar24 - fVar30) * fVar23;
              auVar33._4_4_ = (fVar22 - fVar30) * fVar25;
              auVar33._8_4_ = (fVar30 + fVar24) * fVar26;
              auVar33._12_4_ = (fVar30 + fVar22) * fVar27;
              *pauVar16 = auVar33;
              if (iVar5 < 1) {
                pauVar16 = pauVar16 + 1;
              }
              else {
                fVar31 = SQRT(fVar31 * *(float *)((long)pvVar10 + uVar18 * 4)) * 0.5;
                *(float *)pauVar16[1] = (fVar24 - fVar31) * fVar23;
                *(float *)(pauVar16[1] + 4) = (fVar22 - fVar31) * fVar25;
                *(float *)(pauVar16[1] + 8) = (fVar31 + fVar24) * fVar26;
                *(float *)(pauVar16[1] + 0xc) = (fVar31 + fVar22) * fVar27;
                pauVar16 = pauVar16 + 2;
              }
              if (0 < (int)uVar6) {
                uVar12 = 0;
                do {
                  fVar31 = *(float *)((long)pvVar11 + uVar12 * 4);
                  auVar29 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar31));
                  fVar32 = auVar29._0_4_;
                  fVar34 = fVar31 * fVar32 * fVar32 + -3.0;
                  fVar31 = (float)(~-(uint)(ABS(fVar31) < 1.1754944e-38) &
                                  (uint)(fVar31 * fVar32 * -0.5 * fVar34)) * fVar30;
                  fVar34 = fVar32 * -0.5 * fVar30 * fVar34;
                  *(float *)*pauVar16 = (fVar24 - fVar31) * fVar23;
                  *(float *)((long)*pauVar16 + 4) = (fVar22 - fVar34) * fVar25;
                  *(float *)((long)*pauVar16 + 8) = (fVar24 + fVar31) * fVar26;
                  *(float *)((long)*pauVar16 + 0xc) = (fVar22 + fVar34) * fVar27;
                  if (iVar14 == 0) {
                    pauVar16 = pauVar16 + 1;
                  }
                  else {
                    *(float *)pauVar16[1] = (fVar24 - fVar34) * fVar23;
                    *(float *)(pauVar16[1] + 4) = (fVar22 - fVar31) * fVar25;
                    *(float *)(pauVar16[1] + 8) = (fVar24 + fVar34) * fVar26;
                    *(float *)(pauVar16[1] + 0xc) = (fVar22 + fVar31) * fVar27;
                    pauVar16 = pauVar16 + 2;
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar6 != uVar12);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar4);
          }
          fVar24 = fVar24 + fVar21;
          iVar17 = iVar17 + 1;
        } while (iVar17 != iVar3);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar2);
  }
  if (this->clip == 0) {
    uVar15 = (ulong)(uint)this_00->w;
  }
  else {
    uVar15 = (ulong)this_00->w;
    if ((long)uVar15 < 1) {
      return 0;
    }
    pvVar8 = this_00->data;
    uVar18 = 0;
    do {
      fVar21 = *(float *)((long)pvVar8 + uVar18 * 4);
      if (fVar21 <= 0.0) {
        fVar21 = 0.0;
      }
      if (1.0 <= fVar21) {
        fVar21 = 1.0;
      }
      *(float *)((long)pvVar8 + uVar18 * 4) = fVar21;
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  iVar17 = (int)uVar15;
  iVar14 = iVar17 + 3;
  if (-1 < iVar17) {
    iVar14 = iVar17;
  }
  if (3 < iVar17) {
    iVar14 = iVar14 >> 2;
    pfVar13 = (float *)((uVar15 & 0xffffffff) * 4 + (long)this_00->data);
    do {
      *pfVar13 = this->variances[0];
      pfVar13[1] = this->variances[1];
      pfVar13[2] = this->variances[2];
      pfVar13[3] = this->variances[3];
      pfVar13 = pfVar13 + 4;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  return 0;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
        step_w = (float)image_w / w;
    if (step_h == -233)
        step_h = (float)image_h / h;

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrt(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrt(ar);
                    box_h = min_size / sqrt(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }

        center_y += step_h;
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}